

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall GLDrawList::SortWallIntoPlane(GLDrawList *this,SortNode *head,SortNode *sort)

{
  float fVar1;
  int iVar2;
  int iVar3;
  GLDrawItem *pGVar4;
  GLWall *pGVar5;
  GLFlat *pGVar6;
  SortNode *pSVar7;
  SortNode *pSVar8;
  texcoord *ptVar9;
  double dVar10;
  uint uVar11;
  SortNode *pSVar12;
  GLWall *__src;
  float fVar13;
  double dVar14;
  GLWall local_170;
  
  dVar10 = ViewPos.Z;
  pGVar4 = (this->drawitems).Array;
  iVar2 = pGVar4[head->itemindex].index;
  pGVar5 = (this->walls).Array;
  pGVar6 = (this->flats).Array;
  iVar3 = pGVar4[sort->itemindex].index;
  fVar13 = pGVar6[iVar2].z;
  dVar14 = (double)fVar13;
  if (((pGVar5[iVar3].ztop[0] <= fVar13) && (pGVar5[iVar3].ztop[1] <= fVar13)) ||
     ((__src = pGVar5 + iVar3, fVar13 <= pGVar5[iVar3].zbottom[0] && (fVar13 <= __src->zbottom[1])))
     ) {
    pSVar7 = sort->parent;
    pSVar8 = sort->next;
    if ((pGVar5[iVar3].zbottom[0] < fVar13 && ViewPos.Z >= dVar14) ||
       (fVar13 < pGVar5[iVar3].ztop[0] && ViewPos.Z < dVar14)) {
      if (pSVar7 != (SortNode *)0x0) {
        pSVar7->next = pSVar8;
      }
      if (pSVar8 != (SortNode *)0x0) {
        pSVar8->parent = pSVar7;
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      pSVar7 = head->left;
      if (pSVar7 != (SortNode *)0x0) {
        sort->parent = pSVar7->parent;
        pSVar7->parent = sort;
        sort->next = pSVar7;
        if (sort->parent != (SortNode *)0x0) {
          sort->parent->next = sort;
        }
      }
      head->left = sort;
    }
    else {
      if (pSVar7 != (SortNode *)0x0) {
        pSVar7->next = pSVar8;
      }
      if (pSVar8 != (SortNode *)0x0) {
        pSVar8->parent = pSVar7;
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      pSVar7 = head->right;
      if (pSVar7 != (SortNode *)0x0) {
        sort->parent = pSVar7->parent;
        pSVar7->parent = sort;
        sort->next = pSVar7;
        if (sort->parent != (SortNode *)0x0) {
          sort->parent->next = sort;
        }
      }
      head->right = sort;
    }
  }
  else {
    memcpy(&local_170,__src,200);
    local_170.topplane.normal.X = (__src->topplane).normal.X;
    local_170.topplane.normal.Y = (__src->topplane).normal.Y;
    local_170.topplane.normal.Z = (__src->topplane).normal.Z;
    local_170.topplane.D = (__src->topplane).D;
    local_170.topplane.negiC = (__src->topplane).negiC;
    local_170.bottomplane.normal.X = (__src->bottomplane).normal.X;
    local_170.bottomplane.normal.Y = (__src->bottomplane).normal.Y;
    local_170.bottomplane.normal.Z = (__src->bottomplane).normal.Z;
    local_170.bottomplane.D = (__src->bottomplane).D;
    local_170.bottomplane.negiC = (__src->bottomplane).negiC;
    local_170.sub = __src->sub;
    local_170.zceil = *&__src->zceil;
    local_170.zfloor = *&__src->zfloor;
    local_170.vertindex = __src->vertindex;
    local_170.vertcount = __src->vertcount;
    local_170.seg = __src->seg;
    AddWall(this,&local_170);
    if (((byte)gl.flags & 0x20) != 0) {
      __src->vertcount = 0;
      uVar11 = (this->walls).Count - 1;
      pGVar5 = (this->walls).Array;
      iVar3 = (this->drawitems).Array[sort->itemindex].index;
      fVar13 = pGVar5[iVar3].tcs[1].v;
      fVar1 = pGVar6[iVar2].z;
      fVar13 = ((fVar1 - pGVar5[iVar3].ztop[0]) * (pGVar5[iVar3].tcs[0].v - fVar13)) /
               (pGVar5[iVar3].zbottom[0] - pGVar5[iVar3].ztop[0]) + fVar13;
      if (dVar14 <= dVar10) {
        pGVar5[uVar11].zbottom[0] = fVar1;
        pGVar5[iVar3].ztop[0] = fVar1;
        pGVar5[uVar11].zbottom[1] = fVar1;
        pGVar5[iVar3].ztop[1] = fVar1;
        pGVar5[uVar11].tcs[0].v = fVar13;
        pGVar5[iVar3].tcs[1].v = fVar13;
        pGVar5[uVar11].tcs[3].v = fVar13;
        ptVar9 = pGVar5[iVar3].tcs + 2;
      }
      else {
        pGVar5[iVar3].zbottom[0] = fVar1;
        pGVar5[uVar11].ztop[0] = fVar1;
        pGVar5[iVar3].zbottom[1] = fVar1;
        pGVar5[uVar11].ztop[1] = fVar1;
        pGVar5[iVar3].tcs[3].v = fVar13;
        pGVar5[uVar11].tcs[2].v = fVar13;
        pGVar5[iVar3].tcs[0].v = fVar13;
        ptVar9 = pGVar5[uVar11].tcs + 1;
      }
      ptVar9->v = fVar13;
    }
    pSVar12 = StaticSortNodeArray::GetNew(&SortNodes);
    *(undefined8 *)pSVar12 = 0;
    pSVar12->parent = (SortNode *)0x0;
    pSVar12->next = (SortNode *)0x0;
    pSVar12->left = (SortNode *)0x0;
    pSVar12->equal = (SortNode *)0x0;
    pSVar12->right = (SortNode *)0x0;
    pSVar12->itemindex = (this->drawitems).Count - 1;
    pSVar7 = sort->parent;
    pSVar8 = sort->next;
    if (pSVar7 != (SortNode *)0x0) {
      pSVar7->next = pSVar8;
    }
    if (pSVar8 != (SortNode *)0x0) {
      pSVar8->parent = pSVar7;
    }
    sort->parent = (SortNode *)0x0;
    sort->next = (SortNode *)0x0;
    pSVar7 = head->left;
    if (pSVar7 != (SortNode *)0x0) {
      sort->parent = pSVar7->parent;
      pSVar7->parent = sort;
      sort->next = pSVar7;
      if (sort->parent != (SortNode *)0x0) {
        sort->parent->next = sort;
      }
    }
    head->left = sort;
    pSVar7 = pSVar12->parent;
    pSVar8 = pSVar12->next;
    if (pSVar7 != (SortNode *)0x0) {
      pSVar7->next = pSVar8;
    }
    if (pSVar8 != (SortNode *)0x0) {
      pSVar8->parent = pSVar7;
    }
    pSVar12->parent = (SortNode *)0x0;
    pSVar12->next = (SortNode *)0x0;
    pSVar7 = head->right;
    if (pSVar7 != (SortNode *)0x0) {
      pSVar12->parent = pSVar7->parent;
      pSVar7->parent = pSVar12;
      pSVar12->next = pSVar7;
      if (pSVar12->parent != (SortNode *)0x0) {
        pSVar12->parent->next = pSVar12;
      }
    }
    head->right = pSVar12;
  }
  return;
}

Assistant:

void GLDrawList::SortWallIntoPlane(SortNode * head,SortNode * sort)
{
	GLFlat * fh=&flats[drawitems[head->itemindex].index];
	GLWall * ws=&walls[drawitems[sort->itemindex].index];

	bool ceiling = fh->z > ViewPos.Z;

	if ((ws->ztop[0] > fh->z || ws->ztop[1] > fh->z) && (ws->zbottom[0] < fh->z || ws->zbottom[1] < fh->z))
	{
		// We have to split this wall!

		// WARNING: NEVER EVER push a member of an array onto the array itself.
		// Bad things will happen if the memory must be reallocated!
		GLWall w = *ws;
		AddWall(&w);
	
		// Splitting is done in the shader with clip planes, if available
		if (gl.flags & RFL_NO_CLIP_PLANES)
		{
			GLWall * ws1;
			ws->vertcount = 0;	// invalidate current vertices.
			ws1=&walls[walls.Size()-1];
			ws=&walls[drawitems[sort->itemindex].index];	// may have been reallocated!
			float newtexv = ws->tcs[GLWall::UPLFT].v + ((ws->tcs[GLWall::LOLFT].v - ws->tcs[GLWall::UPLFT].v) / (ws->zbottom[0] - ws->ztop[0])) * (fh->z - ws->ztop[0]);

			// I make the very big assumption here that translucent walls in sloped sectors
			// and 3D-floors never coexist in the same level. If that were the case this
			// code would become extremely more complicated.
			if (!ceiling)
			{
				ws->ztop[1] = ws1->zbottom[1] = ws->ztop[0] = ws1->zbottom[0] = fh->z;
				ws->tcs[GLWall::UPRGT].v = ws1->tcs[GLWall::LORGT].v = ws->tcs[GLWall::UPLFT].v = ws1->tcs[GLWall::LOLFT].v = newtexv;
			}
			else
			{
				ws1->ztop[1] = ws->zbottom[1] = ws1->ztop[0] = ws->zbottom[0] = fh->z;
				ws1->tcs[GLWall::UPLFT].v = ws->tcs[GLWall::LOLFT].v = ws1->tcs[GLWall::UPRGT].v = ws->tcs[GLWall::LORGT].v=newtexv;
			}
		}

		SortNode * sort2 = SortNodes.GetNew();
		memset(sort2, 0, sizeof(SortNode));
		sort2->itemindex = drawitems.Size() - 1;

		head->AddToLeft(sort);
		head->AddToRight(sort2);
	}
	else if ((ws->zbottom[0]<fh->z && !ceiling) || (ws->ztop[0]>fh->z && ceiling))	// completely on the left side
	{
		head->AddToLeft(sort);
	}
	else
	{
		head->AddToRight(sort);
	}

}